

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkResizeVecArray(ARKVecResizeFn resize,void *resize_data,int count,N_Vector tmpl,N_Vector **v,
                     sunindextype lrw_diff,long *lrw,sunindextype liw_diff,long *liw)

{
  int iVar1;
  long lVar2;
  undefined8 in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  code *in_RDI;
  long *in_R8;
  long in_R9;
  long *in_stack_00000008;
  int i;
  int local_3c;
  
  if (*in_R8 != 0) {
    if (in_RDI == (code *)0x0) {
      N_VDestroyVectorArray(*in_R8,in_EDX);
      *in_R8 = 0;
      lVar2 = N_VCloneVectorArray(in_EDX,in_RCX);
      *in_R8 = lVar2;
      if (*in_R8 == 0) {
        return 0;
      }
    }
    else {
      for (local_3c = 0; local_3c < in_EDX; local_3c = local_3c + 1) {
        iVar1 = (*in_RDI)(*(undefined8 *)(*in_R8 + (long)local_3c * 8),in_RCX,in_RSI);
        if (iVar1 != 0) {
          return 0;
        }
      }
    }
    *in_stack_00000008 = in_EDX * in_R9 + *in_stack_00000008;
    *v = (N_Vector *)(in_EDX * lrw_diff + (long)*v);
  }
  return 1;
}

Assistant:

sunbooleantype arkResizeVecArray(ARKVecResizeFn resize, void* resize_data,
                                 int count, N_Vector tmpl, N_Vector** v,
                                 sunindextype lrw_diff, long int* lrw,
                                 sunindextype liw_diff, long int* liw)
{
  int i;

  if (*v != NULL)
  {
    if (resize == NULL)
    {
      N_VDestroyVectorArray(*v, count);
      *v = NULL;
      *v = N_VCloneVectorArray(count, tmpl);
      if (*v == NULL) { return (SUNFALSE); }
    }
    else
    {
      for (i = 0; i < count; i++)
      {
        if (resize((*v)[i], tmpl, resize_data)) { return (SUNFALSE); }
      }
    }
    *lrw += count * lrw_diff;
    *liw += count * liw_diff;
  }
  return (SUNTRUE);
}